

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

void __thiscall fasttext::Vector::mul(Vector *this,Matrix *A,Vector *vec)

{
  int64_t iVar1;
  int64_t iVar2;
  float *pfVar3;
  undefined8 in_RDX;
  long *in_RSI;
  AlignedVector<float> *in_RDI;
  float fVar4;
  int64_t i;
  int64_t in_stack_ffffffffffffffc0;
  size_t sVar5;
  Matrix *in_stack_ffffffffffffffc8;
  size_t local_20;
  
  iVar1 = Matrix::size(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  iVar2 = size((Vector *)0x1c42aa);
  if (iVar1 != iVar2) {
    __assert_fail("A.size(0) == size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/vector.cc"
                  ,0x45,"void fasttext::Vector::mul(const Matrix &, const Vector &)");
  }
  iVar1 = Matrix::size(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  iVar2 = size((Vector *)0x1c42f6);
  if (iVar1 == iVar2) {
    local_20 = 0;
    while( true ) {
      sVar5 = local_20;
      iVar1 = size((Vector *)0x1c4341);
      if (iVar1 <= (long)sVar5) break;
      fVar4 = (float)(**(code **)(*in_RSI + 0x10))(in_RSI,in_RDX,local_20);
      pfVar3 = intgemm::AlignedVector<float>::operator[](in_RDI,local_20);
      *pfVar3 = fVar4;
      local_20 = local_20 + 1;
    }
    return;
  }
  __assert_fail("A.size(1) == vec.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/vector.cc"
                ,0x46,"void fasttext::Vector::mul(const Matrix &, const Vector &)");
}

Assistant:

void Vector::mul(const Matrix& A, const Vector& vec) {
  assert(A.size(0) == size());
  assert(A.size(1) == vec.size());
  for (int64_t i = 0; i < size(); i++) {
    data_[i] = A.dotRow(vec, i);
  }
}